

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

void FILEGetProperNotFoundError(LPSTR lpPath,LPDWORD lpErrorCode)

{
  int iVar1;
  DWORD DVar2;
  char *__s;
  char *pcVar3;
  undefined1 local_b0 [8];
  stat stat_data;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpErrorCode == (LPDWORD)0x0) {
      fprintf(_stderr,"] %s %s:%d","FILEGetProperNotFoundError",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0xa8);
      fprintf(_stderr,"lpErrorCode has to be valid\n");
      return;
    }
    __s = CorUnix::InternalStrdup(lpPath);
    if (__s == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        *lpErrorCode = 8;
        return;
      }
    }
    else {
      pcVar3 = strrchr(__s,0x2f);
      if (((pcVar3 == (char *)0x0) || (*pcVar3 = '\0', *__s == '\0')) ||
         ((iVar1 = stat64(__s,(stat64 *)local_b0), iVar1 == 0 &&
          (((uint)stat_data.st_nlink & 0xf000) == 0x4000)))) {
        DVar2 = 2;
      }
      else {
        DVar2 = 3;
      }
      if (PAL_InitializeChakraCoreCalled != false) {
        *lpErrorCode = DVar2;
        CorUnix::InternalFree(__s);
        if (PAL_InitializeChakraCoreCalled != false) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

void FILEGetProperNotFoundError( LPSTR lpPath, LPDWORD lpErrorCode )
{
    struct stat stat_data;
    LPSTR lpDupedPath = NULL;
    LPSTR lpLastPathSeparator = NULL;

    TRACE( "FILEGetProperNotFoundError( %s )\n", lpPath?lpPath:"(null)" );

    if ( !lpErrorCode )
    {
        ASSERT( "lpErrorCode has to be valid\n" );
        return;
    }

    if ( NULL == ( lpDupedPath = InternalStrdup( lpPath ) ) )
    {
        ERROR( "InternalStrdup() failed!\n" );
        *lpErrorCode = ERROR_NOT_ENOUGH_MEMORY;
        return;
    }

    /* Determine whether it's a file not found or path not found. */
    lpLastPathSeparator = strrchr( lpDupedPath, '/');
    if ( lpLastPathSeparator != NULL )
    {
        *lpLastPathSeparator = '\0';
        
        /* If the last path component is a directory,
           we return file not found. If it's a file or
           doesn't exist, we return path not found. */
        if ( '\0' == *lpDupedPath || 
             ( stat( lpDupedPath, &stat_data ) == 0 && 
             ( stat_data.st_mode & S_IFMT ) == S_IFDIR ) )
        {
            TRACE( "ERROR_FILE_NOT_FOUND\n" );
            *lpErrorCode = ERROR_FILE_NOT_FOUND;
        }
        else
        {
            TRACE( "ERROR_PATH_NOT_FOUND\n" );
            *lpErrorCode = ERROR_PATH_NOT_FOUND;
        }
    }
    else
    {
        TRACE( "ERROR_FILE_NOT_FOUND\n" );
        *lpErrorCode = ERROR_FILE_NOT_FOUND;
    }
    
    InternalFree(lpDupedPath);
    lpDupedPath = NULL;
    TRACE( "FILEGetProperNotFoundError returning TRUE\n" );
    return;
}